

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void pugi::impl::anon_unknown_0::text_output_escaped
               (xml_buffered_writer *writer,char_t *s,chartypex_t type,uint flags)

{
  char_t *pcVar1;
  xml_buffered_writer *this;
  uint in_ECX;
  size_t __n;
  byte in_DL;
  void *__buf;
  xml_buffered_writer *in_RSI;
  xml_buffered_writer *in_RDI;
  uint ch;
  char_t ss;
  char_t *prev;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  uint in_stack_ffffffffffffffd8;
  undefined3 uVar2;
  undefined4 in_stack_ffffffffffffffdc;
  xml_buffered_writer *local_10;
  
  local_10 = in_RSI;
  do {
    this = local_10;
    if (local_10->buffer[0] == '\0') {
      return;
    }
    while( true ) {
      uVar2 = (undefined3)in_stack_ffffffffffffffdc;
      in_stack_ffffffffffffffdc = CONCAT13(local_10->buffer[0],uVar2);
      __n = (size_t)(byte)local_10->buffer[0];
      if (((anonymous_namespace)::chartypex_table[__n] & in_DL) != 0) break;
      in_stack_ffffffffffffffdc = CONCAT13(local_10->buffer[1],uVar2);
      __n = (size_t)(byte)local_10->buffer[1];
      if (((anonymous_namespace)::chartypex_table[__n] & in_DL) != 0) {
        local_10 = (xml_buffered_writer *)(local_10->buffer + 1);
        break;
      }
      in_stack_ffffffffffffffdc = CONCAT13(local_10->buffer[2],uVar2);
      __n = (size_t)(byte)local_10->buffer[2];
      if (((anonymous_namespace)::chartypex_table[__n] & in_DL) != 0) {
        local_10 = (xml_buffered_writer *)(local_10->buffer + 2);
        break;
      }
      in_stack_ffffffffffffffdc = CONCAT13(local_10->buffer[3],uVar2);
      __n = (size_t)(byte)local_10->buffer[3];
      if (((anonymous_namespace)::chartypex_table[__n] & in_DL) != 0) {
        local_10 = (xml_buffered_writer *)(local_10->buffer + 3);
        break;
      }
      local_10 = (xml_buffered_writer *)(local_10->buffer + 4);
    }
    xml_buffered_writer::write_buffer
              (this,(char_t *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
    in_stack_ffffffffffffffd4 = (int)local_10->buffer[0];
    if (local_10->buffer[0] != '\0') {
      if (in_stack_ffffffffffffffd4 == 0x22) {
        if ((in_ECX & 0x200) == 0) {
          xml_buffered_writer::write(in_RDI,0x26,(void *)0x71,0x75);
        }
        else {
          xml_buffered_writer::write(in_RDI,0x22,__buf,__n);
        }
        local_10 = (xml_buffered_writer *)(local_10->buffer + 1);
      }
      else if (in_stack_ffffffffffffffd4 == 0x26) {
        xml_buffered_writer::write(in_RDI,0x26,(void *)0x61,0x6d);
        local_10 = (xml_buffered_writer *)(local_10->buffer + 1);
      }
      else if (in_stack_ffffffffffffffd4 == 0x27) {
        if ((in_ECX & 0x200) == 0) {
          xml_buffered_writer::write(in_RDI,0x27,__buf,__n);
        }
        else {
          xml_buffered_writer::write(in_RDI,0x26,(void *)0x61,0x70);
        }
        local_10 = (xml_buffered_writer *)(local_10->buffer + 1);
      }
      else if (in_stack_ffffffffffffffd4 == 0x3c) {
        xml_buffered_writer::write(in_RDI,0x26,(void *)0x6c,0x74);
        local_10 = (xml_buffered_writer *)(local_10->buffer + 1);
      }
      else if (in_stack_ffffffffffffffd4 == 0x3e) {
        xml_buffered_writer::write(in_RDI,0x26,(void *)0x67,0x74);
        local_10 = (xml_buffered_writer *)(local_10->buffer + 1);
      }
      else {
        pcVar1 = local_10->buffer;
        in_stack_ffffffffffffffd8 = (uint)local_10->buffer[0];
        local_10 = (xml_buffered_writer *)(pcVar1 + 1);
        if ((in_ECX & 0x100) == 0) {
          xml_buffered_writer::write
                    (in_RDI,0x26,(void *)0x23,
                     (ulong)(uint)(int)(char)((char)((ulong)in_stack_ffffffffffffffd8 / 10) + '0'));
        }
      }
    }
  } while( true );
}

Assistant:

PUGI__FN void text_output_escaped(xml_buffered_writer& writer, const char_t* s, chartypex_t type, unsigned int flags)
	{
		while (*s)
		{
			const char_t* prev = s;

			// While *s is a usual symbol
			PUGI__SCANWHILE_UNROLL(!PUGI__IS_CHARTYPEX(ss, type));

			writer.write_buffer(prev, static_cast<size_t>(s - prev));

			switch (*s)
			{
				case 0: break;
				case '&':
					writer.write('&', 'a', 'm', 'p', ';');
					++s;
					break;
				case '<':
					writer.write('&', 'l', 't', ';');
					++s;
					break;
				case '>':
					writer.write('&', 'g', 't', ';');
					++s;
					break;
				case '"':
					if (flags & format_attribute_single_quote)
						writer.write('"');
					else
						writer.write('&', 'q', 'u', 'o', 't', ';');
					++s;
					break;
				case '\'':
					if (flags & format_attribute_single_quote)
						writer.write('&', 'a', 'p', 'o', 's', ';');
					else
						writer.write('\'');
					++s;
					break;
				default: // s is not a usual symbol
				{
					unsigned int ch = static_cast<unsigned int>(*s++);
					assert(ch < 32);

					if (!(flags & format_skip_control_chars))
						writer.write('&', '#', static_cast<char_t>((ch / 10) + '0'), static_cast<char_t>((ch % 10) + '0'), ';');
				}
			}
		}
	}